

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageQualifiersTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::image::anon_unknown_0::MemoryQualifierInstanceBase::iterate
          (TestStatus *__return_storage_ptr__,MemoryQualifierInstanceBase *this)

{
  Vector<unsigned_int,_3> *pVVar1;
  VkPipelineLayout pipelineLayout_00;
  VkCommandBuffer_s *pVVar2;
  RefData<vk::Handle<(vk::HandleType)14>_> data;
  RefData<vk::Handle<(vk::HandleType)16>_> data_00;
  RefData<vk::Handle<(vk::HandleType)18>_> data_01;
  RefData<vk::Handle<(vk::HandleType)24>_> data_02;
  RefData<vk::VkCommandBuffer_s_*> data_03;
  bool bVar3;
  deUint32 queueFamilyIndex_00;
  deUint32 dVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  VkDevice device_00;
  DeviceInterface *deviceInterface_00;
  VkQueue queue_00;
  ulong size;
  ProgramCollection<vk::ProgramBinary> *this_00;
  ProgramBinary *binary;
  Handle<(vk::HandleType)19> *pHVar9;
  Handle<(vk::HandleType)16> *pHVar10;
  Handle<(vk::HandleType)14> *pHVar11;
  Handle<(vk::HandleType)24> *pHVar12;
  VkCommandBuffer_s **ppVVar13;
  Handle<(vk::HandleType)18> *pHVar14;
  Handle<(vk::HandleType)22> *pHVar15;
  Buffer *this_01;
  Allocation *this_02;
  VkDeviceMemory memory;
  VkDeviceSize offset;
  void *data_04;
  TestContext *testCtx;
  allocator<char> local_381;
  string local_380;
  undefined4 local_360;
  allocator<char> local_359;
  string local_358;
  ConstPixelBufferAccess local_338;
  undefined1 local_310 [8];
  ConstPixelBufferAccess referencePixelBuffer;
  TextureLevel referenceImage;
  ConstPixelBufferAccess resultPixelBuffer;
  UVec3 computeGridSize;
  Allocation *allocation;
  UVec3 numGroups;
  Move<vk::VkCommandBuffer_s_*> local_250;
  RefData<vk::VkCommandBuffer_s_*> local_230;
  undefined1 local_210 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_1d0;
  undefined1 local_1b0 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  Move<vk::Handle<(vk::HandleType)18>_> local_180;
  RefData<vk::Handle<(vk::HandleType)18>_> local_160;
  undefined1 local_140 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> pipeline;
  Move<vk::Handle<(vk::HandleType)16>_> local_118;
  RefData<vk::Handle<(vk::HandleType)16>_> local_f8;
  undefined1 local_d8 [8];
  Unique<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  Move<vk::Handle<(vk::HandleType)14>_> local_a8;
  RefData<vk::Handle<(vk::HandleType)14>_> local_88;
  undefined1 local_68 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> shaderModule;
  VkDeviceSize bufferSizeInBytes;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  DeviceInterface *deviceInterface;
  VkDevice device;
  MemoryQualifierInstanceBase *this_local;
  
  device_00 = Context::getDevice((this->super_TestInstance).m_context);
  deviceInterface_00 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  queue_00 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex_00 = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  dVar4 = getNumPixels(this->m_imageType,&this->m_imageSize);
  shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
       *(VkAllocationCallbacks **)&this->m_format;
  iVar5 = tcu::getPixelSize((TextureFormat)
                            shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
                            deleter.m_allocator);
  size = (ulong)(dVar4 * iVar5);
  (*(this->super_TestInstance)._vptr_TestInstance[3])(this,size);
  (*(this->super_TestInstance)._vptr_TestInstance[4])();
  this_00 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  binary = ::vk::ProgramCollection<vk::ProgramBinary>::get(this_00,&this->m_name);
  ::vk::createShaderModule(&local_a8,deviceInterface_00,device_00,binary,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_88,(Move *)&local_a8);
  data.deleter.m_deviceIface._0_4_ = (int)local_88.deleter.m_deviceIface;
  data.object.m_internal = local_88.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_88.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device = local_88.deleter.m_device;
  data.deleter.m_allocator = local_88.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_68,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_a8);
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                     (&(this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>)
  ;
  pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar9->m_internal;
  makePipelineLayout(&local_118,deviceInterface_00,device_00,
                     (VkDescriptorSetLayout)
                     pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                     m_allocator);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_f8,(Move *)&local_118);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_f8.deleter.m_deviceIface;
  data_00.object.m_internal = local_f8.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_f8.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device = local_f8.deleter.m_device;
  data_00.deleter.m_allocator = local_f8.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_d8,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&local_118);
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_d8);
  pipelineLayout_00.m_internal = pHVar10->m_internal;
  pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_68);
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar11->m_internal;
  makeComputePipeline(&local_180,deviceInterface_00,device_00,pipelineLayout_00,
                      (VkShaderModule)
                      cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                      m_allocator);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_160,(Move *)&local_180);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_160.deleter.m_deviceIface;
  data_01.object.m_internal = local_160.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_160.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device = local_160.deleter.m_device;
  data_01.deleter.m_allocator = local_160.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_140,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_180);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,
             deviceInterface_00,device_00,2,queueFamilyIndex_00,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_1d0,
             (Move *)&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_1d0.deleter.m_deviceIface;
  data_02.object.m_internal = local_1d0.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_1d0.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device = local_1d0.deleter.m_device;
  data_02.deleter.m_allocator = local_1d0.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_1b0,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_1b0);
  ::vk::allocateCommandBuffer
            (&local_250,deviceInterface_00,device_00,(VkCommandPool)pHVar12->m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_230,(Move *)&local_250);
  data_03.deleter.m_deviceIface._0_4_ = (int)local_230.deleter.m_deviceIface;
  data_03.object = local_230.object;
  data_03.deleter.m_deviceIface._4_4_ = (int)((ulong)local_230.deleter.m_deviceIface >> 0x20);
  data_03.deleter.m_device = local_230.deleter.m_device;
  data_03.deleter.m_pool.m_internal = local_230.deleter.m_pool.m_internal;
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_210,data_03);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_250);
  ppVVar13 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_210);
  beginCommandBuffer(deviceInterface_00,*ppVVar13);
  ppVVar13 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_210);
  pVVar2 = *ppVVar13;
  pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_140);
  (*deviceInterface_00->_vptr_DeviceInterface[0x4c])
            (deviceInterface_00,pVVar2,1,pHVar14->m_internal);
  ppVVar13 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_210);
  pVVar2 = *ppVVar13;
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_d8);
  numGroups.m_data._4_8_ = pHVar10->m_internal;
  pHVar15 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::get
                      (&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>);
  (*deviceInterface_00->_vptr_DeviceInterface[0x56])
            (deviceInterface_00,pVVar2,1,numGroups.m_data._4_8_,0,1,pHVar15,0,0);
  ppVVar13 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_210);
  (*(this->super_TestInstance)._vptr_TestInstance[5])(this,*ppVVar13,size);
  getNumWorkGroups((anon_unknown_0 *)((long)&allocation + 4),this->m_imageType,&this->m_imageSize);
  ppVVar13 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_210);
  pVVar2 = *ppVVar13;
  pVVar1 = (Vector<unsigned_int,_3> *)((long)&allocation + 4);
  uVar6 = tcu::Vector<unsigned_int,_3>::x(pVVar1);
  uVar7 = tcu::Vector<unsigned_int,_3>::y(pVVar1);
  uVar8 = tcu::Vector<unsigned_int,_3>::z(pVVar1);
  (*deviceInterface_00->_vptr_DeviceInterface[0x5d])
            (deviceInterface_00,pVVar2,(ulong)uVar6,(ulong)uVar7,(ulong)uVar8);
  ppVVar13 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_210);
  (*(this->super_TestInstance)._vptr_TestInstance[6])(this,*ppVVar13,size);
  ppVVar13 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_210);
  endCommandBuffer(deviceInterface_00,*ppVVar13);
  ppVVar13 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_210);
  submitCommandsAndWait(deviceInterface_00,device_00,queue_00,*ppVVar13);
  this_01 = de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::
            operator->(&(this->m_buffer).
                        super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>
                      );
  this_02 = image::Buffer::getAllocation(this_01);
  memory = ::vk::Allocation::getMemory(this_02);
  offset = ::vk::Allocation::getOffset(this_02);
  ::vk::invalidateMappedMemoryRange(deviceInterface_00,device_00,memory,offset,size);
  getShaderGridSize((image *)((long)&resultPixelBuffer.m_data + 4),this->m_imageType,
                    &this->m_imageSize);
  pVVar1 = (Vector<unsigned_int,_3> *)((long)&resultPixelBuffer.m_data + 4);
  uVar6 = tcu::Vector<unsigned_int,_3>::x(pVVar1);
  uVar7 = tcu::Vector<unsigned_int,_3>::y(pVVar1);
  uVar8 = tcu::Vector<unsigned_int,_3>::z(pVVar1);
  data_04 = ::vk::Allocation::getHostPtr(this_02);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)&referenceImage.m_data.m_cap,&this->m_format,uVar6,uVar7,
             uVar8,data_04);
  generateReferenceImage((TextureLevel *)&referencePixelBuffer.m_data,this);
  tcu::TextureLevel::getAccess
            ((PixelBufferAccess *)&local_338,(TextureLevel *)&referencePixelBuffer.m_data);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)local_310,&local_338);
  testCtx = Context::getTestContext((this->super_TestInstance).m_context);
  bVar3 = comparePixelBuffers(testCtx,this->m_imageType,&this->m_imageSize,&this->m_format,
                              (ConstPixelBufferAccess *)local_310,
                              (ConstPixelBufferAccess *)&referenceImage.m_data.m_cap);
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_358,"Passed",&local_359);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_358);
    std::__cxx11::string::~string((string *)&local_358);
    std::allocator<char>::~allocator(&local_359);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_380,"Image comparison failed",&local_381);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_380);
    std::__cxx11::string::~string((string *)&local_380);
    std::allocator<char>::~allocator(&local_381);
  }
  local_360 = 1;
  tcu::TextureLevel::~TextureLevel((TextureLevel *)&referencePixelBuffer.m_data);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_210);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_1b0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_140);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_d8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_68);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus	MemoryQualifierInstanceBase::iterate (void)
{
	const VkDevice			device				= m_context.getDevice();
	const DeviceInterface&	deviceInterface		= m_context.getDeviceInterface();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();

	const VkDeviceSize	bufferSizeInBytes = getNumPixels(m_imageType, m_imageSize) * tcu::getPixelSize(m_format);

	// Prepare resources for the test
	prepareResources(bufferSizeInBytes);

	// Prepare descriptor sets
	prepareDescriptors();

	// Create compute shader
	const vk::Unique<VkShaderModule> shaderModule(createShaderModule(deviceInterface, device, m_context.getBinaryCollection().get(m_name), 0u));

	// Create compute pipeline
	const vk::Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout(deviceInterface, device, *m_descriptorSetLayout));
	const vk::Unique<VkPipeline> pipeline(makeComputePipeline(deviceInterface, device, *pipelineLayout, *shaderModule));

	// Create command buffer
	const Unique<VkCommandPool> cmdPool(createCommandPool(deviceInterface, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer> cmdBuffer(allocateCommandBuffer(deviceInterface, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	// Start recording commands
	beginCommandBuffer(deviceInterface, *cmdBuffer);

	deviceInterface.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);
	deviceInterface.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &m_descriptorSet.get(), 0u, DE_NULL);

	commandsBeforeCompute(*cmdBuffer, bufferSizeInBytes);

	const tcu::UVec3 numGroups = getNumWorkGroups(m_imageType, m_imageSize);
	deviceInterface.cmdDispatch(*cmdBuffer, numGroups.x(), numGroups.y(), numGroups.z());

	commandsAfterCompute(*cmdBuffer, bufferSizeInBytes);

	endCommandBuffer(deviceInterface, *cmdBuffer);

	// Submit and wait for completion
	submitCommandsAndWait(deviceInterface, device, queue, *cmdBuffer);

	// Retrieve data from buffer to host memory
	const Allocation& allocation = m_buffer->getAllocation();
	invalidateMappedMemoryRange(deviceInterface, device, allocation.getMemory(), allocation.getOffset(), bufferSizeInBytes);

	const tcu::UVec3 computeGridSize = getShaderGridSize(m_imageType, m_imageSize);
	tcu::ConstPixelBufferAccess resultPixelBuffer(m_format, computeGridSize.x(), computeGridSize.y(), computeGridSize.z(), allocation.getHostPtr());

	// Create a reference image
	tcu::TextureLevel referenceImage = generateReferenceImage();
	tcu::ConstPixelBufferAccess referencePixelBuffer = referenceImage.getAccess();

	// Validate the result
	if (comparePixelBuffers(m_context.getTestContext(), m_imageType, m_imageSize, m_format, referencePixelBuffer, resultPixelBuffer))
		return tcu::TestStatus::pass("Passed");
	else
		return tcu::TestStatus::fail("Image comparison failed");
}